

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

uint __thiscall
Memory::HeapBlockMap64::Rescan(HeapBlockMap64 *this,Recycler *recycler,bool resetWriteWatch)

{
  uint uVar1;
  uint uVar2;
  Node *pNVar3;
  
  pNVar3 = this->list;
  if (pNVar3 == (Node *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar1 = HeapBlockMap32::Rescan(&pNVar3->map,recycler,false);
      uVar2 = uVar2 + uVar1;
      pNVar3 = pNVar3->next;
    } while (pNVar3 != (Node *)0x0);
  }
  return uVar2;
}

Assistant:

uint
HeapBlockMap64::Rescan(Recycler * recycler, bool resetWriteWatch)
{
    uint scannedPageCount = 0;

    Node * node = this->list;
    while (node != nullptr)
    {
        scannedPageCount += node->map.Rescan(recycler, resetWriteWatch);
        node = node->next;
    }

    return scannedPageCount;
}